

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ber.cc
# Opt level: O0

int cbs_convert_ber(CBS *in,CBB *out,CBS_ASN1_TAG string_tag,int looking_for_eoc,uint32_t depth)

{
  undefined8 cbb;
  int iVar1;
  size_t sVar2;
  uint8_t *data;
  CBS_ASN1_TAG local_94;
  undefined1 local_90 [4];
  CBS_ASN1_TAG out_tag;
  CBB out_contents_storage;
  CBB *out_contents;
  size_t sStack_50;
  int indefinite;
  size_t header_len;
  CBS_ASN1_TAG child_string_tag;
  CBS_ASN1_TAG tag;
  CBS contents;
  uint32_t depth_local;
  int looking_for_eoc_local;
  CBS_ASN1_TAG string_tag_local;
  CBB *out_local;
  CBS *in_local;
  
  contents.len._4_4_ = depth;
  if ((string_tag & 0x20000000) != 0) {
    __assert_fail("!(string_tag & CBS_ASN1_CONSTRUCTED)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/bytestring/ber.cc"
                  ,0x72,"int cbs_convert_ber(CBS *, CBB *, CBS_ASN1_TAG, int, uint32_t)");
  }
  if (depth < 0x81) {
    do {
      while( true ) {
        sVar2 = CBS_len(in);
        if (sVar2 == 0) {
          return (uint)(looking_for_eoc == 0);
        }
        if ((looking_for_eoc != 0) && (iVar1 = cbs_get_eoc(in), iVar1 != 0)) {
          return 1;
        }
        header_len._0_4_ = string_tag;
        iVar1 = CBS_get_any_ber_asn1_element
                          (in,(CBS *)&child_string_tag,(CBS_ASN1_TAG *)((long)&header_len + 4),
                           &stack0xffffffffffffffb0,(int *)0x0,(int *)((long)&out_contents + 4));
        local_94 = header_len._4_4_;
        if (iVar1 == 0) {
          return 0;
        }
        if (string_tag == 0) {
          if (((header_len._4_4_ & 0x20000000) != 0) &&
             (iVar1 = is_string_type(header_len._4_4_), iVar1 != 0)) {
            local_94 = local_94 & 0xdfffffff;
            header_len._0_4_ = local_94;
          }
          iVar1 = CBB_add_asn1(out,(CBB *)local_90,local_94);
          if (iVar1 == 0) {
            return 0;
          }
          out_contents_storage.u._24_8_ = local_90;
        }
        else {
          out_contents_storage.u._24_8_ = out;
          if ((header_len._4_4_ & 0xdfffffff) != string_tag) {
            return 0;
          }
        }
        if (out_contents._4_4_ != 0) break;
        iVar1 = CBS_skip((CBS *)&child_string_tag,sStack_50);
        cbb = out_contents_storage.u._24_8_;
        if (iVar1 == 0) {
          return 0;
        }
        if ((header_len._4_4_ & 0x20000000) == 0) {
          data = CBS_data((CBS *)&child_string_tag);
          sVar2 = CBS_len((CBS *)&child_string_tag);
          iVar1 = CBB_add_bytes((CBB *)cbb,data,sVar2);
          if (iVar1 == 0) {
            return 0;
          }
        }
        else {
          iVar1 = cbs_convert_ber((CBS *)&child_string_tag,(CBB *)out_contents_storage.u._24_8_,
                                  (CBS_ASN1_TAG)header_len,0,contents.len._4_4_ + 1);
          if (iVar1 == 0) {
            return 0;
          }
        }
        iVar1 = CBB_flush(out);
        if (iVar1 == 0) {
          return 0;
        }
      }
      iVar1 = cbs_convert_ber(in,(CBB *)out_contents_storage.u._24_8_,(CBS_ASN1_TAG)header_len,1,
                              contents.len._4_4_ + 1);
    } while ((iVar1 != 0) && (iVar1 = CBB_flush(out), iVar1 != 0));
  }
  return 0;
}

Assistant:

static int cbs_convert_ber(CBS *in, CBB *out, CBS_ASN1_TAG string_tag,
                           int looking_for_eoc, uint32_t depth) {
  assert(!(string_tag & CBS_ASN1_CONSTRUCTED));

  if (depth > kMaxDepth) {
    return 0;
  }

  while (CBS_len(in) > 0) {
    if (looking_for_eoc && cbs_get_eoc(in)) {
      return 1;
    }

    CBS contents;
    CBS_ASN1_TAG tag, child_string_tag = string_tag;
    size_t header_len;
    int indefinite;
    CBB *out_contents, out_contents_storage;
    if (!CBS_get_any_ber_asn1_element(in, &contents, &tag, &header_len,
                                      /*out_ber_found=*/NULL, &indefinite)) {
      return 0;
    }

    if (string_tag != 0) {
      // This is part of a constructed string. All elements must match
      // |string_tag| up to the constructed bit and get appended to |out|
      // without a child element.
      if ((tag & ~CBS_ASN1_CONSTRUCTED) != string_tag) {
        return 0;
      }
      out_contents = out;
    } else {
      CBS_ASN1_TAG out_tag = tag;
      if ((tag & CBS_ASN1_CONSTRUCTED) && is_string_type(tag)) {
        // If a constructed string, clear the constructed bit and inform
        // children to concatenate bodies.
        out_tag &= ~CBS_ASN1_CONSTRUCTED;
        child_string_tag = out_tag;
      }
      if (!CBB_add_asn1(out, &out_contents_storage, out_tag)) {
        return 0;
      }
      out_contents = &out_contents_storage;
    }

    if (indefinite) {
      if (!cbs_convert_ber(in, out_contents, child_string_tag,
                           /*looking_for_eoc=*/1, depth + 1) ||
          !CBB_flush(out)) {
        return 0;
      }
      continue;
    }

    if (!CBS_skip(&contents, header_len)) {
      return 0;
    }

    if (tag & CBS_ASN1_CONSTRUCTED) {
      // Recurse into children.
      if (!cbs_convert_ber(&contents, out_contents, child_string_tag,
                           /*looking_for_eoc=*/0, depth + 1)) {
        return 0;
      }
    } else {
      // Copy primitive contents as-is.
      if (!CBB_add_bytes(out_contents, CBS_data(&contents),
                         CBS_len(&contents))) {
        return 0;
      }
    }

    if (!CBB_flush(out)) {
      return 0;
    }
  }

  return looking_for_eoc == 0;
}